

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O1

bool __thiscall KDReports::ReportPrivate::skipHeadersFooters(ReportPrivate *this)

{
  QDebug this_00;
  QByteArrayView QVar1;
  QDebug local_70;
  qreal local_68;
  QArrayDataPointer<char16_t> local_60;
  char *local_48;
  QByteArrayView local_40;
  undefined8 local_30;
  char *local_28;
  char *local_20;
  char *local_18;
  
  local_68 = rawMainTextDocHeight(this);
  if (local_68 <= 0.0) {
    local_30 = 0x9400000002;
    local_28 = 
    "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
    ;
    local_20 = "bool KDReports::ReportPrivate::skipHeadersFooters() const";
    local_18 = "default";
    QMessageLogger::debug();
    this_00.stream = local_70.stream;
    local_48 = 
    "Not enough height for headers and footers in this page size, hiding headers and footers.";
    ::QByteArrayView::QByteArrayView<const_char_*,_true>(&local_40,&local_48);
    QVar1.m_data = (storage_type *)local_40.m_size;
    QVar1.m_size = (qsizetype)&local_60;
    QString::fromUtf8(QVar1);
    QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
    if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_70.stream,' ');
    }
    QDebug::~QDebug(&local_70);
  }
  return local_68 <= 0.0;
}

Assistant:

bool KDReports::ReportPrivate::skipHeadersFooters() const
{
    const bool skip = rawMainTextDocHeight() <= 0;
    if (skip) {
        qDebug() << "Not enough height for headers and footers in this page size, hiding headers and footers.";
    }
    return skip;
}